

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O3

void __thiscall Assimp::ScaleProcess::applyScaling(ScaleProcess *this,aiNode *currentNode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  aiVector3t<float> local_58;
  aiVector3t<float> local_48;
  aiQuaterniont<float> local_38;
  
  if (currentNode != (aiNode *)0x0) {
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    local_58.x = 0.0;
    local_58.y = 0.0;
    local_58.z = 0.0;
    local_38._0_12_ = ZEXT812(0x3f800000);
    local_38.z = 0.0;
    aiMatrix4x4t<float>::Decompose(&currentNode->mTransformation,&local_58,&local_38,&local_48);
    fVar10 = this->mScale;
    fVar2 = local_38.y * local_38.y + local_38.z * local_38.z;
    fVar6 = 1.0 - (fVar2 + fVar2);
    fVar13 = local_38.x * local_38.z + local_38.y * local_38.w;
    fVar13 = fVar13 + fVar13;
    fVar11 = local_38.x * local_38.y + local_38.z * local_38.w;
    fVar11 = fVar11 + fVar11;
    fVar21 = local_38.y * local_38.z - local_38.w * local_38.x;
    fVar21 = fVar21 + fVar21;
    fVar3 = local_38.x * local_38.z - local_38.y * local_38.w;
    fVar14 = local_38.w * local_38.x + local_38.y * local_38.z;
    fVar15 = fVar11 * 0.0;
    fVar16 = (local_38.z * local_38.z + local_38.x * local_38.x) * -2.0 + 1.0;
    fVar2 = fVar16 * 0.0;
    fVar1 = (-local_38.z * local_38.w + local_38.y * local_38.x) * 2.0;
    fVar7 = fVar6 * 0.0;
    fVar8 = fVar7 + fVar15;
    fVar22 = fVar21 * 0.0;
    fVar4 = fVar1 * 0.0;
    fVar5 = fVar4 + fVar2;
    fVar3 = fVar3 + fVar3;
    fVar14 = fVar14 + fVar14;
    fVar17 = (local_38.x * local_38.x + local_38.y * local_38.y) * -2.0 + 1.0;
    fVar18 = fVar13 * 0.0 + fVar22;
    fVar9 = fVar3 * 0.0;
    fVar12 = local_48.x * fVar10 * 0.0;
    fVar19 = fVar6 + fVar15 + fVar9 + fVar12;
    fVar6 = fVar14 * 0.0;
    fVar20 = fVar2 + fVar1 + fVar6 + fVar12;
    fVar15 = fVar17 * 0.0;
    fVar12 = fVar13 + fVar22 + fVar15 + fVar12;
    fVar1 = local_48.y * fVar10 * 0.0;
    fVar22 = fVar11 + fVar7 + fVar9 + fVar1;
    fVar16 = fVar16 + fVar4 + fVar6 + fVar1;
    fVar1 = fVar13 * 0.0 + fVar21 + fVar15 + fVar1;
    fVar2 = fVar10 * local_48.z * 0.0;
    fVar4 = fVar3 + fVar8 + fVar2;
    fVar11 = fVar14 + fVar5 + fVar2;
    fVar2 = fVar17 + fVar18 + fVar2;
    fVar13 = fVar20 * 0.0;
    fVar7 = fVar19 * 0.0 + fVar13;
    fVar3 = fVar12 * 0.0;
    fVar14 = local_48.x * fVar10 + 0.0;
    fVar17 = fVar14 * 0.0;
    (currentNode->mTransformation).a1 = fVar17 + fVar3 + fVar19 * local_58.x + fVar13;
    (currentNode->mTransformation).a2 = fVar17 + fVar3 + fVar19 * 0.0 + fVar20 * local_58.y;
    (currentNode->mTransformation).a3 = local_58.z * fVar12 + fVar7 + fVar17;
    (currentNode->mTransformation).a4 = fVar7 + fVar3 + fVar14;
    fVar3 = fVar16 * 0.0;
    fVar12 = fVar22 * 0.0 + fVar3;
    fVar7 = fVar1 * 0.0;
    fVar13 = local_48.y * fVar10 + 0.0;
    fVar14 = fVar13 * 0.0;
    (currentNode->mTransformation).b1 = fVar14 + fVar7 + fVar22 * local_58.x + fVar3;
    (currentNode->mTransformation).b2 = fVar14 + fVar7 + fVar22 * 0.0 + fVar16 * local_58.y;
    (currentNode->mTransformation).b3 = local_58.z * fVar1 + fVar12 + fVar14;
    fVar3 = fVar5 + fVar6 + 0.0;
    fVar1 = fVar3 * 0.0;
    (currentNode->mTransformation).b4 = fVar12 + fVar7 + fVar13;
    fVar7 = fVar11 * 0.0;
    fVar5 = fVar8 + fVar9 + 0.0;
    fVar10 = fVar10 * local_48.z + 0.0;
    fVar6 = fVar10 * 0.0;
    fVar8 = fVar7 + fVar4 * 0.0;
    fVar9 = fVar1 + fVar5 * 0.0;
    (currentNode->mTransformation).c1 = fVar6 + fVar2 * 0.0 + fVar4 * local_58.x + fVar7;
    (currentNode->mTransformation).c2 = fVar6 + fVar2 * 0.0 + fVar4 * 0.0 + fVar11 * local_58.y;
    fVar4 = fVar18 + fVar15 + 0.0;
    (currentNode->mTransformation).c3 = local_58.z * fVar2 + fVar8 + fVar6;
    (currentNode->mTransformation).c4 = fVar10 + fVar2 * 0.0 + fVar8;
    (currentNode->mTransformation).d1 = fVar4 * 0.0 + fVar1 + fVar5 * local_58.x + 0.0;
    (currentNode->mTransformation).d2 = fVar4 * 0.0 + fVar3 * local_58.y + fVar5 * 0.0 + 0.0;
    (currentNode->mTransformation).d3 = fVar4 * local_58.z + fVar9 + 0.0;
    (currentNode->mTransformation).d4 = fVar4 * 0.0 + fVar9 + 1.0;
  }
  return;
}

Assistant:

void ScaleProcess::applyScaling( aiNode *currentNode ) {
    if ( nullptr != currentNode ) {
        // Reconstruct matrix by transform rather than by scale 
        // This prevent scale values being changed which can
        // be meaningful in some cases 
        // like when you want the modeller to 
        // see 1:1 compatibility.
        
        aiVector3D pos, scale;
        aiQuaternion rotation;
        currentNode->mTransformation.Decompose( scale, rotation, pos);
        
        aiMatrix4x4 translation;
        aiMatrix4x4::Translation( pos * mScale, translation );
        
        aiMatrix4x4 scaling;

        // note: we do not use mScale here, this is on purpose.
        aiMatrix4x4::Scaling( scale, scaling );

        aiMatrix4x4 RotMatrix = aiMatrix4x4 (rotation.GetMatrix());

        currentNode->mTransformation = translation * RotMatrix * scaling;
    }
}